

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O3

size_t bin_text_write(io_buf *io,char *data,size_t len,stringstream *msg,bool text)

{
  char *data_00;
  size_t sVar1;
  undefined3 in_register_00000081;
  char *local_58 [2];
  char local_48 [16];
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28 [16];
  
  if (CONCAT31(in_register_00000081,text) == 0) {
    local_58[0] = (char *)CONCAT44(local_58[0]._4_4_,(int)len);
    io_buf::bin_write_fixed(io,(char *)local_58,4);
    io_buf::bin_write_fixed(io,data,(ulong)local_58[0] & 0xffffffff);
    sVar1 = ((ulong)local_58[0] & 0xffffffff) + 4;
  }
  else {
    std::__cxx11::stringbuf::str();
    data_00 = local_58[0];
    std::__cxx11::stringbuf::str();
    sVar1 = io_buf::bin_write_fixed(io,data_00,local_30);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
    std::__cxx11::stringbuf::str((string *)(msg + 0x18));
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return sVar1;
}

Assistant:

inline size_t bin_text_write(io_buf& io, char* data, size_t len, std::stringstream& msg, bool text)
{
  if (text)
  {
    size_t temp = io.bin_write_fixed(msg.str().c_str(), msg.str().size());
    msg.str("");
    return temp;
  }
  else
    return bin_write(io, data, (uint32_t)len);
  return 0;
}